

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.h
# Opt level: O2

set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> * __thiscall
libDAI::FactorGraph::findVars
          (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
           *__return_storage_ptr__,FactorGraph *this,VarSet *ns)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  VarSet *pVVar3;
  pointer pVVar4;
  pair<std::_Rb_tree_iterator<unsigned_long>,_bool> pVar5;
  unsigned_long local_30;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  pVVar3 = ns;
  for (pVVar4 = (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar4 != (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_finish; pVVar4 = pVVar4 + 1) {
    iVar2 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[8])(this,pVVar4,pVVar3);
    local_30 = CONCAT44(extraout_var,iVar2);
    pVar5 = std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::_M_insert_unique<unsigned_long>(&__return_storage_ptr__->_M_t,&local_30);
    pVVar3 = pVar5._8_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::set<size_t> findVars( VarSet &ns ) const {
                std::set<size_t> indexes;
                for( VarSet::const_iterator n = ns.begin(); n != ns.end(); n++ )
                    indexes.insert( findVar( *n ) );
                return indexes;
            }